

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_heresiarch.cpp
# Opt level: O0

int AF_A_SorcSpinBalls(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  AActor *self_00;
  DObject *this;
  bool bVar1;
  bool local_7a;
  bool local_77;
  FName local_74;
  FName local_70;
  FName local_6c;
  undefined1 local_68 [8];
  DVector3 pos;
  AActor *mo;
  FStateParamInfo *stateinfo;
  AActor *stateowner;
  AHeresiarch *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  int numparam_local;
  VMValue *param_local;
  VMFrameStack *stack_local;
  
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_heresiarch.cpp"
                  ,0xd8,"int AF_A_SorcSpinBalls(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  bVar1 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar1 = true, (param->field_0).field_1.atag != 1)) {
    bVar1 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (bVar1) {
    self_00 = *(AActor **)&param->field_0;
    local_77 = true;
    if (self_00 != (AActor *)0x0) {
      local_77 = DObject::IsKindOf((DObject *)self_00,AHeresiarch::RegistrationInfo.MyClass);
    }
    if (local_77 != false) {
      if ((1 < numparam) && (param[1].field_0.field_3.Type != 0xff)) {
        bVar1 = false;
        if ((param[1].field_0.field_3.Type == '\x03') &&
           (bVar1 = true, param[1].field_0.field_1.atag != 1)) {
          bVar1 = param[1].field_0.field_1.a == (void *)0x0;
        }
        if (!bVar1) {
          __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_heresiarch.cpp"
                        ,0xd8,
                        "int AF_A_SorcSpinBalls(VMFrameStack *, VMValue *, int, VMReturn *, int)");
        }
        this = (DObject *)param[1].field_0.field_1.a;
        local_7a = true;
        if (this != (DObject *)0x0) {
          local_7a = DObject::IsKindOf(this,AActor::RegistrationInfo.MyClass);
        }
        if (local_7a == false) {
          __assert_fail("stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))",
                        "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_heresiarch.cpp"
                        ,0xd8,
                        "int AF_A_SorcSpinBalls(VMFrameStack *, VMValue *, int, VMReturn *, int)");
        }
      }
      if ((2 < numparam) && (param[2].field_0.field_3.Type != 0xff)) {
        bVar1 = false;
        if ((param[2].field_0.field_3.Type == '\x03') &&
           (bVar1 = true, param[2].field_0.field_1.atag != 8)) {
          bVar1 = param[2].field_0.field_1.a == (void *)0x0;
        }
        if (!bVar1) {
          __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_heresiarch.cpp"
                        ,0xd8,
                        "int AF_A_SorcSpinBalls(VMFrameStack *, VMValue *, int, VMReturn *, int)");
        }
      }
      self_00->SpawnState = self_00->SpawnState + 2;
      A_SlowBalls(self_00);
      self_00->args[0] = 0;
      self_00->args[3] = 5;
      self_00->args[4] = 7;
      TAngle<double>::operator=
                ((TAngle<double> *)&self_00[1].super_DThinker.super_DObject.Class,1.0);
      AActor::PosPlusZ((DVector3 *)local_68,self_00,-self_00->Floorclip + self_00->Height);
      FName::FName(&local_6c,"SorcBall1");
      pos.Z = (double)Spawn(&local_6c,(DVector3 *)local_68,NO_REPLACE);
      if ((AActor *)pos.Z != (AActor *)0x0) {
        TObjPtr<AActor>::operator=(&((AActor *)pos.Z)->target,self_00);
        *(undefined4 *)((long)pos.Z + 0x1b0) = 0x12;
      }
      FName::FName(&local_70,"SorcBall2");
      pos.Z = (double)Spawn(&local_70,(DVector3 *)local_68,NO_REPLACE);
      if ((AActor *)pos.Z != (AActor *)0x0) {
        TObjPtr<AActor>::operator=(&((AActor *)pos.Z)->target,self_00);
      }
      FName::FName(&local_74,"SorcBall3");
      pos.Z = (double)Spawn(&local_74,(DVector3 *)local_68,NO_REPLACE);
      if ((AActor *)pos.Z != (AActor *)0x0) {
        TObjPtr<AActor>::operator=(&((AActor *)pos.Z)->target,self_00);
      }
      return 0;
    }
    __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AHeresiarch))",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_heresiarch.cpp"
                  ,0xd8,"int AF_A_SorcSpinBalls(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_heresiarch.cpp"
                ,0xd8,"int AF_A_SorcSpinBalls(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_SorcSpinBalls)
{
	PARAM_ACTION_PROLOGUE_TYPE(AHeresiarch);

	AActor *mo;

	self->SpawnState += 2;		// [RH] Don't spawn balls again
	A_SlowBalls(self);
	self->args[0] = 0;								// Currently no defense
	self->args[3] = SORC_NORMAL;
	self->args[4] = SORCBALL_INITIAL_SPEED;		// Initial orbit speed
	self->BallAngle = 1.;

	DVector3 pos = self->PosPlusZ(-self->Floorclip + self->Height);
	
	mo = Spawn("SorcBall1", pos, NO_REPLACE);
	if (mo)
	{
		mo->target = self;
		mo->special2 = SORCFX4_RAPIDFIRE_TIME;
	}
	mo = Spawn("SorcBall2", pos, NO_REPLACE);
	if (mo) mo->target = self;
	mo = Spawn("SorcBall3", pos, NO_REPLACE);
	if (mo) mo->target = self;
	return 0;
}